

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryBuffer.cpp
# Opt level: O3

ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
* getFileAux<llvm::WritableMemoryBuffer>
            (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
             *__return_storage_ptr__,Twine *Filename,int64_t FileSize,uint64_t MapSize,
            uint64_t Offset,bool RequiresNullTerminator,bool IsVolatile)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long *plVar4;
  char *pcVar5;
  int *piVar6;
  ssize_t sVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined4 extraout_var;
  long __offset;
  _func_int *__buf;
  error_code eVar10;
  int FD;
  file_status Status;
  int local_84;
  mapped_file_region *local_80;
  undefined1 local_78 [24];
  uid_t uStack_60;
  gid_t local_5c;
  undefined4 uStack_58;
  undefined4 uStack_54;
  file_type fStack_50;
  perms local_4c;
  dev_t local_48;
  nlink_t nStack_40;
  ino_t local_38;
  
  eVar10 = llvm::sys::fs::openFileForRead(Filename,&local_84,F_None,(SmallVectorImpl<char> *)0x0);
  iVar3 = local_84;
  if (eVar10._M_value != 0) {
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(int *)&__return_storage_ptr__->field_0 = eVar10._M_value;
    *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar10._M_cat;
    return eVar10._0_8_;
  }
  if (getOpenFileImpl<llvm::WritableMemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
      ::PageSize == '\0') {
    getFileAux<llvm::WritableMemoryBuffer>();
  }
  if ((MapSize == 0xffffffffffffffff) && (MapSize = FileSize, FileSize == -1)) {
    uStack_58 = 0;
    uStack_54 = 0;
    fStack_50 = status_error;
    local_78._16_8_ = (char *)0x0;
    uStack_60 = 0;
    local_5c = 0;
    local_78._0_8_ = (_func_int **)0x0;
    local_78._8_8_ = (error_category *)0x0;
    local_4c = perms_not_known;
    local_48 = 0;
    nStack_40 = 0;
    local_38 = 0;
    eVar10 = llvm::sys::fs::status(iVar3,(file_status *)local_78);
    if (eVar10._M_value != 0) {
      __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
      *(int *)&__return_storage_ptr__->field_0 = eVar10._M_value;
      *(error_category **)((long)&__return_storage_ptr__->field_0 + 8) = eVar10._M_cat;
      goto LAB_00174ef6;
    }
    if ((fStack_50 != regular_file) && (fStack_50 != block_file)) {
      getMemoryBufferForStream(__return_storage_ptr__,iVar3,Filename);
      goto LAB_00174ef6;
    }
    MapSize = CONCAT44(uStack_54,uStack_58);
  }
  if (((!RequiresNullTerminator) && (0x3fff < MapSize)) &&
     (getOpenFileImpl<llvm::WritableMemoryBuffer>(int,llvm::Twine_const&,unsigned_long,unsigned_long,long,bool,bool)
      ::PageSize <= MapSize)) {
    local_78._0_8_ = local_78._0_8_ & 0xffffffff00000000;
    local_78._8_8_ = std::_V2::system_category();
    plVar4 = (long *)operator_new(0x30,(NamedBufferAlloc *)Filename);
    *plVar4 = (long)&PTR__MemoryBufferMMapFile_0020cf88;
    iVar1 = llvm::sys::fs::mapped_file_region::alignment();
    iVar2 = llvm::sys::fs::mapped_file_region::alignment();
    local_80 = (mapped_file_region *)(plVar4 + 3);
    llvm::sys::fs::mapped_file_region::mapped_file_region
              ((mapped_file_region *)(plVar4 + 3),iVar3,priv,((long)(iVar1 + -1) & Offset) + MapSize
               ,(long)-iVar2 & Offset,(error_code *)local_78);
    if (local_78._0_4_ == 0) {
      pcVar5 = llvm::sys::fs::mapped_file_region::const_data(local_80);
      iVar1 = llvm::sys::fs::mapped_file_region::alignment();
      plVar4[1] = (long)(pcVar5 + ((long)(iVar1 + -1) & Offset));
      plVar4[2] = (long)(pcVar5 + ((long)(iVar1 + -1) & Offset) + MapSize);
      if (local_78._0_4_ == 0) {
        __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
        *(long **)&__return_storage_ptr__->field_0 = plVar4;
        goto LAB_00174ef6;
      }
    }
    (**(code **)(*plVar4 + 8))(plVar4);
  }
  llvm::WritableMemoryBuffer::getNewUninitMemBuffer
            ((WritableMemoryBuffer *)local_78,MapSize,Filename);
  uVar8 = local_78._0_8_;
  if ((_func_int **)local_78._0_8_ == (_func_int **)0x0) {
    uVar8 = std::_V2::generic_category();
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
    *(undefined4 *)&__return_storage_ptr__->field_0 = 0xc;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar8;
  }
  else {
    if (MapSize != 0) {
      __buf = *(_func_int **)(local_78._0_8_ + 8);
      piVar6 = __errno_location();
      local_80 = (mapped_file_region *)(Offset + MapSize);
      do {
        __offset = (long)local_80 - MapSize;
        while( true ) {
          *piVar6 = 0;
          sVar7 = pread(iVar3,__buf,MapSize,__offset);
          if (sVar7 != -1) break;
          iVar1 = *piVar6;
          if (iVar1 != 4) {
            uVar9 = std::_V2::generic_category();
            __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 | 1;
            *(int *)&__return_storage_ptr__->field_0 = iVar1;
            *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = uVar9;
            (**(code **)(*(_func_int **)uVar8 + 8))();
            goto LAB_00174ef6;
          }
        }
        if (sVar7 == 0) {
          memset(__buf,0,MapSize);
          break;
        }
        __buf = __buf + sVar7;
        MapSize = MapSize - sVar7;
      } while (MapSize != 0);
    }
    __return_storage_ptr__->field_0x10 = __return_storage_ptr__->field_0x10 & 0xfe;
    *(undefined8 *)&__return_storage_ptr__->field_0 = uVar8;
  }
LAB_00174ef6:
  iVar3 = close(local_84);
  return (ErrorOr<std::unique_ptr<llvm::WritableMemoryBuffer,_std::default_delete<llvm::WritableMemoryBuffer>_>_>
          *)CONCAT44(extraout_var,iVar3);
}

Assistant:

static ErrorOr<std::unique_ptr<MB>>
getFileAux(const Twine &Filename, int64_t FileSize, uint64_t MapSize,
           uint64_t Offset, bool RequiresNullTerminator, bool IsVolatile) {
  int FD;
  std::error_code EC = sys::fs::openFileForRead(Filename, FD, sys::fs::OF_None);

  if (EC)
    return EC;

  auto Ret = getOpenFileImpl<MB>(FD, Filename, FileSize, MapSize, Offset,
                                 RequiresNullTerminator, IsVolatile);
  close(FD);
  return Ret;
}